

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address.cpp
# Opt level: O0

void __thiscall cppnet::Address::SetIp(Address *this,string *ip)

{
  undefined1 local_58 [32];
  undefined1 local_38 [40];
  string *ip_local;
  Address *this_local;
  
  local_38._32_8_ = ip;
  ip_local = (string *)this;
  if (this->_address_type == AT_IPV6) {
    ToIpv6((Address *)local_38,(string *)this);
    std::__cxx11::string::operator=((string *)&this->_ip,(string *)local_38);
    std::__cxx11::string::~string((string *)local_38);
  }
  else {
    ToIpv4((Address *)local_58,(string *)this);
    std::__cxx11::string::operator=((string *)&this->_ip,(string *)local_58);
    std::__cxx11::string::~string((string *)local_58);
  }
  return;
}

Assistant:

void Address::SetIp(const std::string& ip) {
    if (_address_type == AT_IPV6) {
        _ip = ToIpv6(ip);
    
    } else {
        _ip = ToIpv4(ip);
    }
}